

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void draw_msgwin(void)

{
  bool bVar1;
  WINDOW *pWVar2;
  uint uVar3;
  attr_t aVar4;
  wchar_t wVar5;
  int iVar6;
  wchar_t wVar7;
  
  if (msgwin == (WINDOW *)0x0) {
    iVar6 = -2;
  }
  else {
    iVar6 = (int)msgwin->_maxy;
  }
  bVar1 = false;
  for (; pWVar2 = msgwin, -1 < iVar6; iVar6 = iVar6 + -1) {
    uVar3 = 1;
    if (msgwin != (WINDOW *)0x0) {
      uVar3 = ~(int)msgwin->_maxy;
    }
    wVar5 = iVar6 + uVar3 + curline + L'\x01';
    wVar7 = iVar6 + 0x29 + uVar3 + curline;
    if (L'\xffffffff' < wVar5) {
      wVar7 = wVar5;
    }
    if ((wVar7 == start_of_turn_curline) && (bVar1 = true, settings.darkmsg != '\0')) {
      aVar4 = curses_color_attr(4,0);
      wattr_on(pWVar2,aVar4,0);
    }
    wmove(msgwin,iVar6,0);
    waddnstr(msgwin,msglines + wVar7,0xffffffff);
    if (((msgwin == (WINDOW *)0x0) || (msgwin->_curx != 0)) || (msglines[wVar7][0] == '\0')) {
      wclrtoeol();
    }
  }
  if (bVar1) {
    if (settings.darkmsg != '\0') {
      aVar4 = curses_color_attr(4,0);
      wattr_off(pWVar2,aVar4,0);
    }
  }
  else {
    start_of_turn_curline = L'\xffffffff';
  }
  wnoutrefresh(msgwin);
  return;
}

Assistant:

void draw_msgwin(void)
{
    int i, pos;
    nh_bool drew_older = FALSE;

    for (i = getmaxy(msgwin) - 1; i >= 0; i--) {
	pos = curline - getmaxy(msgwin) + 1 + i;
	if (pos < 0)
	    pos += MAX_MSGLINES;
	if (pos == start_of_turn_curline) {
	    if (settings.darkmsg)
		wattron(msgwin, curses_color_attr(CLR_BLUE, 0));
	    drew_older = TRUE;
	}
	wmove(msgwin, i, 0);
	waddstr(msgwin, msglines[pos]);
	/* Only clear the remainder of the line if the cursor did not wrap. */
	if (getcurx(msgwin) || !*msglines[pos])
	    wclrtoeol(msgwin);
    }

    if (drew_older) {
	if (settings.darkmsg)
	    wattroff(msgwin, curses_color_attr(CLR_BLUE, 0));
    } else {
	/* Don't dim out messages if the message buffer wraps. */
	start_of_turn_curline = -1;
    }

    wnoutrefresh(msgwin);
}